

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall Liby::Connection::destroyLater(Connection *this)

{
  EventLoop *this_00;
  anon_class_8_1_8991fb9c local_38;
  BasicHandler local_30;
  Connection *local_10;
  Connection *this_local;
  
  this_00 = this->loop_;
  local_38.this = this;
  local_10 = this;
  std::function<void()>::function<Liby::Connection::destroyLater()::__0,void>
            ((function<void()> *)&local_30,&local_38);
  EventLoop::nextTick(this_00,&local_30);
  std::function<void_()>::~function(&local_30);
  return;
}

Assistant:

void Connection::destroyLater() {
    loop_->nextTick([this] { destroy(); });
}